

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

VkResult Fossilize::CreateComputePipelines
                   (VkDevice device,VkPipelineCache pipelineCache,uint32_t createInfoCount,
                   VkComputePipelineCreateInfo *pCreateInfos,VkAllocationCallbacks *pAllocator,
                   VkPipeline *pPipelines)

{
  Instance *pIVar1;
  undefined4 uVar2;
  bool bVar3;
  uint32_t i_3;
  VkResult VVar4;
  VkResult VVar5;
  LogLevel LVar6;
  Device *this;
  void *pvVar7;
  void *pvVar8;
  PFN_vkGetShaderModuleCreateInfoIdentifierEXT p_Var9;
  VkComputePipelineCreateInfo *pVVar10;
  ulong count;
  long lVar11;
  uint32_t i_1;
  VkPipeline *ppVVar12;
  void **outpNext;
  ulong uVar13;
  VkPipeline pipeline;
  VkComputePipelineCreateInfo *pVVar14;
  long lVar15;
  uint32_t i;
  uint uVar16;
  ulong uVar17;
  byte bVar18;
  VkComputePipelineCreateInfo local_90;
  
  bVar18 = 0;
  this = get_device_layer((Fossilize *)device,(VkDevice)pipelineCache);
  pIVar1 = this->pInstance;
  count = (ulong)createInfoCount;
  if ((pIVar1->enableCrashHandler == false) && ((pIVar1->synchronized & 1U) == 0)) {
    bVar3 = false;
    if ((createInfoCount != 0) && (bVar3 = false, pIVar1->enablePrecompileQA != false)) {
      for (lVar15 = 0; count * 0x60 - lVar15 != 0; lVar15 = lVar15 + 0x60) {
        pvVar8 = *(void **)((long)&pCreateInfos->pNext + lVar15);
        pvVar7 = findpNext(pvVar8,VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO);
        if (pvVar7 == (void *)0x0) {
          uVar16 = *(uint *)((long)&pCreateInfos->flags + lVar15);
        }
        else {
          uVar16 = (uint)*(undefined8 *)((long)pvVar7 + 0x10);
        }
        pvVar7 = findpNext(pvVar8,VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR);
        pvVar8 = findpNext(pvVar8,VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR);
        if ((pvVar8 != (void *)0x0) && (*(int *)((long)pvVar8 + 0x10) != 0)) {
LAB_001106d6:
          bVar3 = false;
          goto LAB_00110895;
        }
        if (pvVar7 == (void *)0x0) {
          if ((uVar16 >> 8 & 1) != 0) goto LAB_001106d6;
        }
        else {
          bVar3 = false;
          if (((uVar16 >> 10 & 1) == 0 && *(int *)((long)pvVar7 + 0x10) != 0) ||
             ((uVar16 & 0x100) != 0)) goto LAB_00110895;
        }
      }
      ScratchAllocator::ScratchAllocator((ScratchAllocator *)&local_90);
      pVVar10 = ScratchAllocator::allocate_n<VkComputePipelineCreateInfo>
                          ((ScratchAllocator *)&local_90,count);
      memcpy(pVVar10,pCreateInfos,count * 0x60);
      outpNext = &pVVar10->pNext;
      uVar17 = count;
      while (bVar3 = uVar17 != 0, uVar17 = uVar17 - 1, bVar3) {
        *(byte *)((long)outpNext + 9) = *(byte *)((long)outpNext + 9) | 1;
        bVar3 = shallowCopyPnextChain((ScratchAllocator *)&local_90,*outpNext,outpNext);
        if (!bVar3) goto LAB_00110877;
        pvVar8 = findpNext(*outpNext,VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO);
        if (pvVar8 != (void *)0x0) {
          *(byte *)((long)pvVar8 + 0x11) = *(byte *)((long)pvVar8 + 0x11) | 1;
        }
        outpNext = outpNext + 0xc;
      }
      VVar5 = (*this->pTable->CreateComputePipelines)
                        (device,(VkPipelineCache)0x0,createInfoCount,pVVar10,pAllocator,pPipelines);
      if (VVar5 == VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) {
        pVVar10 = pCreateInfos;
        for (uVar17 = 0; count != uVar17; uVar17 = uVar17 + 1) {
          if (pPipelines[uVar17] == (VkPipeline)0x0) {
            pvVar8 = findpNext(pVVar10->pNext,VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO)
            ;
            if (pvVar8 == (void *)0x0) {
              uVar13 = (ulong)pVVar10->flags;
            }
            else {
              uVar13 = *(ulong *)((long)pvVar8 + 0x10);
            }
            LVar6 = get_thread_log_level();
            if ((int)LVar6 < 2) {
              bVar3 = Internal::log_thread_callback
                                (LOG_DEFAULT,
                                 "QA: Pipeline compilation required for pipeline, flags %08x\'%08x.\n"
                                 ,uVar13 >> 0x20,uVar13 & 0xffffffff);
              if (!bVar3) {
                fprintf(_stderr,
                        "Fossilize WARN: QA: Pipeline compilation required for pipeline, flags %08x\'%08x.\n"
                        ,uVar13 >> 0x20,uVar13 & 0xffffffff);
              }
            }
            Device::registerPrecompileQAFailure(this,1);
            if (this->usesModuleIdentifiers == true) {
              p_Var9 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
            }
            else {
              p_Var9 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
            }
            bVar3 = StateRecorder::record_compute_pipeline
                              (this->recorder,pPipelines[uVar17],pVVar10,pPipelines,createInfoCount,
                               0,device,p_Var9);
            if (((!bVar3) && (LVar6 = get_thread_log_level(), (int)LVar6 < 2)) &&
               (bVar3 = Internal::log_thread_callback
                                  (LOG_DEFAULT,
                                   "Recording graphics pipeline failed, usually caused by unsupported pNext.\n"
                                  ), !bVar3)) {
              fwrite("Fossilize WARN: Recording graphics pipeline failed, usually caused by unsupported pNext.\n"
                     ,0x59,1,_stderr);
            }
          }
          else {
            Device::registerPrecompileQASuccess(this,1);
          }
          pVVar10 = pVVar10 + 1;
        }
        for (uVar17 = 0; count != uVar17; uVar17 = uVar17 + 1) {
          (*this->pTable->DestroyPipeline)(this->device,pPipelines[uVar17],pAllocator);
          pPipelines[uVar17] = (VkPipeline)0x0;
        }
LAB_00110877:
        VVar5 = VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT;
      }
      else {
        Device::registerPrecompileQASuccess(this,createInfoCount);
      }
      ScratchAllocator::~ScratchAllocator((ScratchAllocator *)&local_90);
      bVar3 = true;
      if (VVar5 != VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) {
        return VVar5;
      }
    }
LAB_00110895:
    VVar5 = (*this->pTable->CreateComputePipelines)
                      (device,pipelineCache,createInfoCount,pCreateInfos,pAllocator,pPipelines);
    if ((!bVar3) && (VVar5 == VK_SUCCESS)) {
      VVar5 = VK_SUCCESS;
      for (uVar17 = 0; count != uVar17; uVar17 = uVar17 + 1) {
        if (this->usesModuleIdentifiers == true) {
          p_Var9 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
        }
        else {
          p_Var9 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
        }
        bVar3 = StateRecorder::record_compute_pipeline
                          (this->recorder,pPipelines[uVar17],pCreateInfos,pPipelines,createInfoCount
                           ,0,device,p_Var9);
        if (((!bVar3) && (LVar6 = get_thread_log_level(), (int)LVar6 < 2)) &&
           (bVar3 = Internal::log_thread_callback
                              (LOG_DEFAULT,
                               "Failed to record compute pipeline, usually caused by unsupported pNext.\n"
                              ), !bVar3)) {
          fwrite("Fossilize WARN: Failed to record compute pipeline, usually caused by unsupported pNext.\n"
                 ,0x58,1,_stderr);
        }
        pCreateInfos = pCreateInfos + 1;
      }
    }
  }
  else {
    for (uVar17 = 0; count != uVar17; uVar17 = uVar17 + 1) {
      pPipelines[uVar17] = (VkPipeline)0x0;
    }
    VVar5 = VK_SUCCESS;
    ppVVar12 = pPipelines;
    for (lVar15 = 0; -count != lVar15; lVar15 = lVar15 + -1) {
      pVVar10 = pCreateInfos;
      pVVar14 = &local_90;
      for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
        uVar2 = *(undefined4 *)&pVVar10->field_0x4;
        pVVar14->sType = pVVar10->sType;
        *(undefined4 *)&pVVar14->field_0x4 = uVar2;
        pVVar10 = (VkComputePipelineCreateInfo *)((long)pVVar10 + (ulong)bVar18 * -0x10 + 8);
        pVVar14 = (VkComputePipelineCreateInfo *)((long)pVVar14 + (ulong)bVar18 * -0x10 + 8);
      }
      if ((-1 < local_90.basePipelineIndex &
          local_90.basePipelineHandle == (VkPipeline)0x0 & (byte)local_90.flags >> 2) == 1) {
        local_90.basePipelineHandle = pPipelines[(uint)local_90.basePipelineIndex];
        local_90.basePipelineIndex = 0xffffffff;
      }
      if (this->pInstance->synchronized == true) {
        if (this->usesModuleIdentifiers == true) {
          p_Var9 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
        }
        else {
          p_Var9 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
        }
        bVar3 = StateRecorder::record_compute_pipeline
                          (this->recorder,(VkPipeline)0x0,&local_90,(VkPipeline *)0x0,0,0,device,
                           p_Var9);
        if (((!bVar3) && (LVar6 = get_thread_log_level(), (int)LVar6 < 2)) &&
           (bVar3 = Internal::log_thread_callback(LOG_DEFAULT,"Failed to capture eagerly.\n"),
           !bVar3)) {
          fwrite("Fossilize WARN: Failed to capture eagerly.\n",0x2b,1,_stderr);
        }
      }
      Instance::braceForComputePipelineCrash(this->recorder,&local_90);
      VVar4 = (*this->pTable->CreateComputePipelines)
                        (device,pipelineCache,1,&local_90,pAllocator,ppVVar12);
      Instance::completedPipelineCompilation();
      if (VVar4 == VK_SUCCESS) {
        pipeline = *ppVVar12;
      }
      else {
        pipeline = (VkPipeline)0x0;
      }
      if (this->usesModuleIdentifiers == true) {
        p_Var9 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
      }
      else {
        p_Var9 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
      }
      bVar3 = StateRecorder::record_compute_pipeline
                        (this->recorder,pipeline,&local_90,(VkPipeline *)0x0,0,0,device,p_Var9);
      if (((!bVar3) && (LVar6 = get_thread_log_level(), (int)LVar6 < 2)) &&
         (bVar3 = Internal::log_thread_callback
                            (LOG_DEFAULT,
                             "Failed to record compute pipeline, usually caused by unsupported pNext.\n"
                            ), !bVar3)) {
        fwrite("Fossilize WARN: Failed to record compute pipeline, usually caused by unsupported pNext.\n"
               ,0x58,1,_stderr);
      }
      if (VVar4 == VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) {
        VVar5 = VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT;
      }
      if (VVar4 < VK_SUCCESS) {
        for (lVar11 = 0; -lVar11 != lVar15; lVar11 = lVar11 + 1) {
          (*this->pTable->DestroyPipeline)(device,pPipelines[lVar11],pAllocator);
        }
        return VVar4;
      }
      if ((VVar4 == VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) && ((local_90.flags._1_1_ & 2) != 0)) {
        return VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT;
      }
      ppVVar12 = ppVVar12 + 1;
      pCreateInfos = pCreateInfos + 1;
    }
  }
  return VVar5;
}

Assistant:

static VKAPI_ATTR VkResult VKAPI_CALL CreateComputePipelines(VkDevice device, VkPipelineCache pipelineCache,
                                                             uint32_t createInfoCount,
                                                             const VkComputePipelineCreateInfo *pCreateInfos,
                                                             const VkAllocationCallbacks *pAllocator,
                                                             VkPipeline *pPipelines)
{
	auto *layer = get_device_layer(device);

	if (layer->getInstance()->capturesParanoid())
		return CreateComputePipelinesParanoid(layer, device, pipelineCache, createInfoCount, pCreateInfos, pAllocator, pPipelines);
	else
		return CreateComputePipelinesNormal(layer, device, pipelineCache, createInfoCount, pCreateInfos, pAllocator, pPipelines);
}